

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,int jumpIfTrue,int jumpIfNull)

{
  ExprList_item *pEVar1;
  char cVar2;
  u16 uVar3;
  undefined4 uVar4;
  long lVar5;
  Expr *pEVar6;
  Expr *pEVar7;
  int regFree1;
  Expr exprAnd;
  Expr exprX;
  Expr compRight;
  Expr compLeft;
  
  regFree1 = 0;
  pEVar6 = pExpr->pLeft;
  pEVar7 = &exprX;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    cVar2 = pEVar6->affinity;
    uVar3 = pEVar6->flags;
    uVar4 = *(undefined4 *)&pEVar6->field_0x4;
    pEVar7->op = pEVar6->op;
    pEVar7->affinity = cVar2;
    pEVar7->flags = uVar3;
    *(undefined4 *)&pEVar7->field_0x4 = uVar4;
    pEVar6 = (Expr *)&pEVar6->u;
    pEVar7 = (Expr *)&pEVar7->u;
  }
  exprAnd.op = 'E';
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = 'P';
  pEVar1 = ((pExpr->x).pList)->a;
  compLeft.pRight = pEVar1->pExpr;
  compRight.op = 'N';
  compRight.pRight = pEVar1[1].pExpr;
  compRight.pLeft = &exprX;
  compLeft.pLeft = &exprX;
  exprX.iTable = sqlite3ExprCodeTemp(pParse,&exprX,&regFree1);
  exprX.op = 0x84;
  if (jumpIfTrue == 0) {
    sqlite3ExprIfFalse(pParse,&exprAnd,dest,jumpIfNull);
  }
  else {
    sqlite3ExprIfTrue(pParse,&exprAnd,dest,jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse,regFree1);
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump here if the jump is taken */
  int jumpIfTrue,   /* Take the jump if the BETWEEN is true */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
  Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  Expr exprX;       /* The  x  subexpression */
  int regFree1 = 0; /* Temporary use register */

  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  exprX = *pExpr->pLeft;
  exprAnd.op = TK_AND;
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = TK_GE;
  compLeft.pLeft = &exprX;
  compLeft.pRight = pExpr->x.pList->a[0].pExpr;
  compRight.op = TK_LE;
  compRight.pLeft = &exprX;
  compRight.pRight = pExpr->x.pList->a[1].pExpr;
  exprX.iTable = sqlite3ExprCodeTemp(pParse, &exprX, &regFree1);
  exprX.op = TK_REGISTER;
  if( jumpIfTrue ){
    sqlite3ExprIfTrue(pParse, &exprAnd, dest, jumpIfNull);
  }else{
    sqlite3ExprIfFalse(pParse, &exprAnd, dest, jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse, regFree1);

  /* Ensure adequate test coverage */
  testcase( jumpIfTrue==0 && jumpIfNull==0 && regFree1==0 );
  testcase( jumpIfTrue==0 && jumpIfNull==0 && regFree1!=0 );
  testcase( jumpIfTrue==0 && jumpIfNull!=0 && regFree1==0 );
  testcase( jumpIfTrue==0 && jumpIfNull!=0 && regFree1!=0 );
  testcase( jumpIfTrue!=0 && jumpIfNull==0 && regFree1==0 );
  testcase( jumpIfTrue!=0 && jumpIfNull==0 && regFree1!=0 );
  testcase( jumpIfTrue!=0 && jumpIfNull!=0 && regFree1==0 );
  testcase( jumpIfTrue!=0 && jumpIfNull!=0 && regFree1!=0 );
}